

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  Message *this;
  unsigned_long uVar1;
  string filename;
  int in_stack_000001dc;
  string *in_stack_000001e0;
  char (*in_stack_ffffffffffffff98) [7];
  Message *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffd0;
  string local_20 [32];
  
  Message::Message(in_stack_ffffffffffffffd0);
  Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  getpid();
  Message::operator<<(in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  this = Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [6])in_stack_ffffffffffffff98);
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x13397d);
  uVar1 = anon_unknown_31::ReadProcFileField<unsigned_long>(in_stack_000001e0,in_stack_000001dc);
  std::__cxx11::string::~string(local_20);
  return uVar1;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}